

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qownlanguagedata.cpp
# Opt level: O1

void loadPHPData(QMultiHash<char,_QLatin1String> *types,QMultiHash<char,_QLatin1String> *keywords,
                QMultiHash<char,_QLatin1String> *builtin,QMultiHash<char,_QLatin1String> *literals,
                QMultiHash<char,_QLatin1String> *other)

{
  if (PHPDataInitialized == '\0') {
    initPHPData();
    PHPDataInitialized = '\x01';
  }
  QMultiHash<char,_QLatin1String>::operator=(types,&php_types);
  QMultiHash<char,_QLatin1String>::operator=(keywords,&php_keywords);
  QMultiHash<char,_QLatin1String>::operator=(builtin,&php_builtin);
  QMultiHash<char,_QLatin1String>::operator=(literals,&php_literals);
  QMultiHash<char,_QLatin1String>::operator=(other,&php_other);
  return;
}

Assistant:

void loadPHPData(QMultiHash<char, QLatin1String> &types,
                 QMultiHash<char, QLatin1String> &keywords,
                 QMultiHash<char, QLatin1String> &builtin,
                 QMultiHash<char, QLatin1String> &literals,
                 QMultiHash<char, QLatin1String> &other) {
    if (!PHPDataInitialized) {
        initPHPData();
        PHPDataInitialized = true;
    }
    types = php_types;
    keywords = php_keywords;
    builtin = php_builtin;
    literals = php_literals;
    other = php_other;
}